

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg,char *pass,bool check_all,bool check_relink)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  int iVar3;
  char *pcVar4;
  char cVar5;
  pointer this_01;
  string *__x;
  undefined7 in_register_00000089;
  pointer ppcVar6;
  allocator local_139;
  cmLocalUnixMakefileGenerator3 *local_138;
  undefined4 local_12c;
  char *local_128;
  string doc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> children;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_commands;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  cmGlobalUnixMakefileGenerator3 *local_68;
  ostream *local_60;
  string *local_58;
  string makeTarget;
  
  local_12c = (undefined4)CONCAT71(in_register_00000089,check_relink);
  local_138 = lg;
  local_68 = this;
  local_60 = ruleFileStream;
  pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)lg);
  std::__cxx11::string::string((string *)&makeTarget,pcVar4,(allocator *)&doc);
  std::__cxx11::string::append((char *)&makeTarget);
  std::__cxx11::string::append((char *)&makeTarget);
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128 = pass;
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            (&targets,&(local_138->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                       GeneratorTargets);
  if (targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    cVar5 = (char)local_12c;
    local_58 = &(local_138->super_cmLocalCommonGenerator).ConfigName;
    ppcVar6 = targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      this_00 = *ppcVar6;
      TVar2 = cmGeneratorTarget::GetType(this_00);
      if (TVar2 < GLOBAL_TARGET) {
        if (check_all) {
          local_88._M_allocated_capacity = (size_type)&local_78;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"EXCLUDE_FROM_ALL","")
          ;
          bVar1 = cmGeneratorTarget::GetPropertyAsBool(this_00,(string *)&local_88);
          if (bVar1 || cVar5 != '\x01') {
            bVar1 = !bVar1;
LAB_00397683:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_allocated_capacity != &local_78) {
              operator_delete((void *)local_88._M_allocated_capacity,
                              local_78._M_allocated_capacity + 1);
            }
          }
          else {
LAB_0039766b:
            bVar1 = cmGeneratorTarget::NeedRelinkBeforeInstall(this_00,local_58);
            if (check_all) goto LAB_00397683;
          }
          if (bVar1 == false) goto LAB_00397702;
        }
        else if ((char)local_12c != '\0') goto LAB_0039766b;
        cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_(&doc,local_138,this_00)
        ;
        std::__cxx11::string::append((char *)&doc);
        std::__cxx11::string::append((char *)&doc);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,&doc);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)doc._M_dataplus._M_p != &doc.field_2) {
          operator_delete(doc._M_dataplus._M_p,doc.field_2._M_allocated_capacity + 1);
        }
      }
LAB_00397702:
      ppcVar6 = ppcVar6 + 1;
    } while (ppcVar6 !=
             targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&doc,(cmLocalGenerator *)local_138);
  cmStateSnapshot::GetChildren(&children,(cmStateSnapshot *)&doc);
  if (children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_start !=
      children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_01 = children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl
              .super__Vector_impl_data._M_start;
    do {
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&doc,this_01);
      pcVar4 = cmStateDirectory::GetCurrentBinary((cmStateDirectory *)&doc);
      std::__cxx11::string::string((string *)&no_commands,pcVar4,&local_139);
      std::__cxx11::string::append((char *)&no_commands);
      std::__cxx11::string::append((char *)&no_commands);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&depends,(value_type *)&no_commands);
      if (no_commands.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&no_commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(no_commands.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((no_commands.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      this_01 = this_01 + 1;
    } while (this_01 !=
             children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __x = &local_68->EmptyRuleHackDepends;
    iVar3 = std::__cxx11::string::compare((char *)__x);
    if (iVar3 != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&depends,__x);
    }
  }
  doc._M_dataplus._M_p = (pointer)&doc.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&doc,"Convenience name for \"","");
  std::__cxx11::string::append((char *)&doc);
  std::__cxx11::string::append((char *)&doc);
  no_commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  no_commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  no_commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmLocalUnixMakefileGenerator3::WriteMakeRule
            (local_138,local_60,doc._M_dataplus._M_p,&makeTarget,&depends,&no_commands,true,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&no_commands);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)doc._M_dataplus._M_p != &doc.field_2) {
    operator_delete(doc._M_dataplus._M_p,doc.field_2._M_allocated_capacity + 1);
  }
  if (children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)children.
                          super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)children.
                          super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(targets.
                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)targets.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)targets.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)makeTarget._M_dataplus._M_p != &makeTarget.field_2) {
    operator_delete(makeTarget._M_dataplus._M_p,makeTarget.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg,
  const char* pass, bool check_all, bool check_relink)
{
  // Get the relative path to the subdirectory from the top.
  std::string makeTarget = lg->GetCurrentBinaryDirectory();
  makeTarget += "/";
  makeTarget += pass;

  // The directory-level rule should depend on the target-level rules
  // for all targets in the directory.
  std::vector<std::string> depends;
  std::vector<cmGeneratorTarget*> targets = lg->GetGeneratorTargets();
  for (std::vector<cmGeneratorTarget*>::iterator l = targets.begin();
       l != targets.end(); ++l) {
    cmGeneratorTarget* gtarget = *l;
    int type = gtarget->GetType();
    if ((type == cmStateEnums::EXECUTABLE) ||
        (type == cmStateEnums::STATIC_LIBRARY) ||
        (type == cmStateEnums::SHARED_LIBRARY) ||
        (type == cmStateEnums::MODULE_LIBRARY) ||
        (type == cmStateEnums::OBJECT_LIBRARY) ||
        (type == cmStateEnums::UTILITY)) {
      // Add this to the list of depends rules in this directory.
      if ((!check_all || !gtarget->GetPropertyAsBool("EXCLUDE_FROM_ALL")) &&
          (!check_relink ||
           gtarget->NeedRelinkBeforeInstall(lg->GetConfigName()))) {
        std::string tname = lg->GetRelativeTargetDirectory(gtarget);
        tname += "/";
        tname += pass;
        depends.push_back(tname);
      }
    }
  }

  // The directory-level rule should depend on the directory-level
  // rules of the subdirectories.
  std::vector<cmStateSnapshot> children = lg->GetStateSnapshot().GetChildren();
  for (std::vector<cmStateSnapshot>::const_iterator ci = children.begin();
       ci != children.end(); ++ci) {
    std::string subdir = ci->GetDirectory().GetCurrentBinary();
    subdir += "/";
    subdir += pass;
    depends.push_back(subdir);
  }

  // Work-around for makes that drop rules that have no dependencies
  // or commands.
  if (depends.empty() && this->EmptyRuleHackDepends != "") {
    depends.push_back(this->EmptyRuleHackDepends);
  }

  // Write the rule.
  std::string doc = "Convenience name for \"";
  doc += pass;
  doc += "\" pass in the directory.";
  std::vector<std::string> no_commands;
  lg->WriteMakeRule(ruleFileStream, doc.c_str(), makeTarget, depends,
                    no_commands, true);
}